

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O0

void getOptions(int *argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  undefined8 *__ptr;
  undefined8 *in_RSI;
  int *in_RDI;
  int pos;
  int p;
  int newp;
  int oldp;
  char **newArgv;
  char *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  int local_20;
  int local_1c;
  
  strcpy(commandLine,"Command: ");
  sVar2 = strlen(commandLine);
  iVar5 = (int)sVar2;
  iVar4 = 0;
  while( true ) {
    uVar3 = false;
    if (iVar4 < *in_RDI) {
      in_stack_ffffffffffffffc8 = (char *)(long)(iVar5 + 1);
      sVar2 = strlen((char *)in_RSI[iVar4]);
      uVar3 = in_stack_ffffffffffffffc8 + sVar2 < (char *)0x3e8;
    }
    if ((bool)uVar3 == false) break;
    strcat(commandLine,(char *)in_RSI[iVar4]);
    strcat(commandLine," ");
    sVar2 = strlen((char *)in_RSI[iVar4]);
    iVar5 = iVar5 + (int)sVar2 + 1;
    iVar4 = iVar4 + 1;
  }
  initOptions();
  __ptr = (undefined8 *)malloc((long)*in_RDI << 3);
  *__ptr = *in_RSI;
  local_20 = 1;
  local_1c = 1;
  while (local_1c < *in_RDI) {
    sVar2 = strlen((char *)in_RSI[local_1c]);
    if ((sVar2 == 0) || (*(char *)in_RSI[local_1c] != '-')) {
      __ptr[local_20] = in_RSI[local_1c];
      local_20 = local_20 + 1;
      local_1c = local_1c + 1;
    }
    else {
      iVar1 = checkBooleanOption(in_stack_ffffffffffffffc8);
      if (iVar1 == 0) {
        if ((local_1c + 1 < *in_RDI) &&
           (iVar1 = checkStringOption((char *)CONCAT44(iVar4,iVar5),
                                      (char *)CONCAT17(uVar3,in_stack_ffffffffffffffd0)), iVar1 != 0
           )) {
          local_1c = local_1c + 2;
        }
        else if ((local_1c + 1 < *in_RDI) &&
                (iVar1 = checkIntOption((char *)CONCAT44(iVar4,iVar5),
                                        (char *)CONCAT17(uVar3,in_stack_ffffffffffffffd0)),
                iVar1 != 0)) {
          local_1c = local_1c + 2;
        }
        else {
          fprintf(_stderr,"Unrecognised option %s\n",in_RSI[local_1c]);
          local_1c = local_1c + 1;
        }
      }
      else {
        local_1c = local_1c + 1;
      }
    }
  }
  for (iVar5 = 0; iVar5 < local_20; iVar5 = iVar5 + 1) {
    in_RSI[iVar5] = __ptr[iVar5];
  }
  *in_RDI = local_20;
  free(__ptr);
  if ((booleanOptions[3] == 0) && (booleanOptions[5] == 0)) {
    return;
  }
  printHelp();
  exit(1);
}

Assistant:

void getOptions (int *argc, char * argv[])
{
    char **newArgv;
    int oldp, newp, p, pos;

    strcpy (commandLine, "Command: ");
    pos=strlen(commandLine);
    for (p=0; p<*argc && pos+1+strlen(argv[p])<1000;p++)
    {
        strcat (commandLine, argv[p]);
        strcat (commandLine, " ");
        pos += 1 + strlen (argv[p]);
    }


    initOptions();

    newArgv = (char **) malloc ( (*argc)*sizeof(char *));

    oldp = 0;
    newp = 0;

    newArgv[newp++] = argv[oldp++];

    while (oldp < *argc)
    {
        if (strlen (argv[oldp]) == 0 || argv[oldp][0] != '-')
            newArgv[newp++] = argv[oldp++];
        else
        {
            if (checkBooleanOption (argv[oldp]))
                oldp++;
            else
                if (oldp+1 < *argc && checkStringOption (argv[oldp],argv[oldp+1]))
                    oldp += 2;
            else
                if (oldp+1 < *argc && checkIntOption (argv[oldp],argv[oldp+1]))
                    oldp += 2;
            else
            {
                fprintf (stderr, "Unrecognised option %s\n", argv[oldp]);
                oldp++;
            }
        }

    }

    for (p=0;p<newp;p++)
        argv[p] = newArgv[p];
    *argc = newp;

    free (newArgv);

    if (booleanOptions[HELP] || booleanOptions[HELP_SHORT])
    {
        printHelp();
        exit(1);
    }


}